

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Params *params)

{
  ulong __n;
  uint uVar1;
  ulong *puVar2;
  FieldGenerator *p;
  scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *this_00;
  ulong uVar3;
  int i;
  long i_00;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int next_has_bit_index;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
  *local_48;
  FieldGeneratorMap *local_40;
  Params *local_38;
  
  this->descriptor_ = descriptor;
  uVar3 = (ulong)*(int *)(descriptor + 0x2c);
  __n = uVar3 * 8;
  uVar4 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar4 = 0xffffffffffffffff;
  }
  local_48 = &this->field_generators_;
  if ((long)uVar3 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_40 = this;
  local_38 = params;
  puVar2 = (ulong *)operator_new__(uVar4);
  *puVar2 = uVar3;
  if (uVar3 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *)(puVar2 + 1),0,__n);
  }
  local_48->array_ =
       (scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *)(puVar2 + 1);
  next_has_bit_index = 0;
  lVar6 = 0;
  uVar5 = 0;
  for (i_00 = 0; i_00 < (int)uVar3; i_00 = i_00 + 1) {
    p = MakeGenerator((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar6),local_38,
                      &next_has_bit_index);
    uVar1 = 1;
    if ((uVar5 & 1) == 0) {
      uVar1 = (*p->_vptr_FieldGenerator[2])(p);
    }
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
              ::operator[](local_48,i_00);
    internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>::reset(this_00,p);
    uVar3 = (ulong)*(uint *)(descriptor + 0x2c);
    lVar6 = lVar6 + 0xa8;
    uVar5 = uVar1;
  }
  local_40->total_bits_ = next_has_bit_index;
  local_40->saved_defaults_needed_ = (bool)((byte)uVar5 & 1);
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(
    const Descriptor* descriptor, const Params &params)
  : descriptor_(descriptor),
    field_generators_(
      new scoped_ptr<FieldGenerator>[descriptor->field_count()]) {

  int next_has_bit_index = 0;
  bool saved_defaults_needed = false;
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    FieldGenerator* field_generator = MakeGenerator(
        descriptor->field(i), params, &next_has_bit_index);
    saved_defaults_needed = saved_defaults_needed
        || field_generator->SavedDefaultNeeded();
    field_generators_[i].reset(field_generator);
  }
  total_bits_ = next_has_bit_index;
  saved_defaults_needed_ = saved_defaults_needed;
}